

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupAlias.cpp
# Opt level: O2

Url * __thiscall
Vault::Identity::GroupAlias::getUrl(Url *__return_storage_ptr__,GroupAlias *this,Path *path)

{
  long *plVar1;
  allocator<char> local_41;
  string local_40 [32];
  
  plVar1 = *(long **)this;
  std::__cxx11::string::string<std::allocator<char>>(local_40,"/v1/identity/group-alias/",&local_41)
  ;
  (**(code **)(*plVar1 + 0x18))(__return_storage_ptr__,plVar1,local_40,path);
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

Vault::Url Vault::Identity::GroupAlias::getUrl(const Path &path) {
  return client_.getUrl("/v1/identity/group-alias/", path);
}